

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-calcs.c
# Opt level: O3

wchar_t calc_blows(player *p,object *obj,player_state_conflict *state,wchar_t extra_blows)

{
  player_class *ppVar1;
  wchar_t wVar2;
  int16_t iVar3;
  int iVar4;
  int iVar5;
  wchar_t wVar6;
  
  if (obj == (object *)0x0) {
    wVar6 = L'\0';
  }
  else {
    iVar3 = object_weight_one(obj);
    wVar6 = (wchar_t)iVar3;
  }
  ppVar1 = p->class;
  wVar2 = ppVar1->min_weight;
  if (ppVar1->min_weight < wVar6) {
    wVar2 = wVar6;
  }
  iVar4 = (ppVar1->att_multiply * adj_str_blow[state->stat_ind[0]]) / wVar2;
  iVar5 = 0xb;
  if (iVar4 < 0xb) {
    iVar5 = iVar4;
  }
  iVar4 = ppVar1->max_attacks * 100;
  iVar5 = (int)(10000 / (long)blows_table[iVar5][adj_dex_blow[state->stat_ind[3]]]);
  if (iVar4 <= iVar5) {
    iVar5 = iVar4;
  }
  wVar6 = iVar5 + extra_blows * 100;
  if (wVar6 < L'É') {
    wVar6 = L'È';
  }
  return wVar6;
}

Assistant:

int calc_blows(struct player *p, const struct object *obj,
			   struct player_state *state, int extra_blows)
{
	int blows;
	int str_index, dex_index;
	int div;
	int blow_energy;

	int weight = (obj == NULL) ? 0 : object_weight_one(obj);
	int min_weight = p->class->min_weight;

	/* Enforce a minimum "weight" (tenth pounds) */
	div = (weight < min_weight) ? min_weight : weight;

	/* Get the strength vs weight */
	str_index = adj_str_blow[state->stat_ind[STAT_STR]] *
			p->class->att_multiply / div;

	/* Maximal value */
	if (str_index > 11) str_index = 11;

	/* Index by dexterity */
	dex_index = MIN(adj_dex_blow[state->stat_ind[STAT_DEX]], 11);

	/* Use the blows table to get energy per blow */
	blow_energy = blows_table[str_index][dex_index];

	blows = MIN((10000 / blow_energy), (100 * p->class->max_attacks));

	/* Require at least one blow, two for O-combat */
	return MAX(blows + (100 * extra_blows), 200);
}